

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

qpdf_offset_t __thiscall
QPDF::processXRefStream(QPDF *this,qpdf_offset_t xref_offset,QPDFObjectHandle *xref_obj)

{
  byte bVar1;
  qpdf_offset_t f1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int f0;
  int f2;
  type_conflict4 *ptVar5;
  element_type *peVar6;
  size_t __val;
  size_t sVar7;
  size_t sVar8;
  QPDFExc *pQVar9;
  reference ppVar10;
  type_conflict4 *ptVar11;
  reference pvVar12;
  reference pvVar13;
  ulong *puVar14;
  pointer pMVar15;
  allocator<char> local_3c9;
  string local_3c8 [32];
  QPDFObjectHandle local_3a8;
  undefined1 local_392;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340 [32];
  QPDFObjectHandle local_320;
  allocator<char> local_309;
  string local_308;
  QPDFObjectHandle local_2e8;
  QPDFObjGen local_2d4;
  int local_2cc;
  ulong uStack_2c8;
  int k;
  size_t j;
  array<long_long,_3UL> fields;
  int i;
  type_conflict4 *sec_entries;
  type_conflict4 *obj;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_288;
  iterator __end1;
  iterator __begin1;
  type *__range1;
  uchar *p;
  undefined1 local_260 [7];
  bool saw_first_compressed_object;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string_view local_1c0;
  undefined1 local_1b0 [8];
  QPDFExc x;
  size_t expected_size;
  size_t actual_size;
  shared_ptr<Buffer> bp;
  type *indx;
  type_conflict4 *num_entries;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_e0;
  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> local_c0;
  int local_9c;
  type *ptStack_98;
  int max_num_entries;
  type *W;
  type_conflict4 *entry_size;
  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> local_78;
  pair<int,_std::array<int,_3UL>_> local_58;
  undefined1 local_48 [8];
  QPDFObjectHandle dict;
  anon_class_16_2_099dce64 damaged;
  QPDFObjectHandle *xref_obj_local;
  qpdf_offset_t xref_offset_local;
  QPDF *this_local;
  
  dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_48);
  std::function<QPDFExc(std::basic_string_view<char,std::char_traits<char>>)>::
  function<QPDF::processXRefStream(long_long,QPDFObjectHandle&)::__0&,void>
            ((function<QPDFExc(std::basic_string_view<char,std::char_traits<char>>)> *)&local_78,
             (anon_class_16_2_099dce64 *)
             &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_58 = processXRefW(this,(QPDFObjectHandle *)local_48,&local_78);
  std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            (&local_78);
  W = (type *)std::get<0ul,int,std::array<int,3ul>>(&local_58);
  ptStack_98 = std::get<1ul,int,std::array<int,3ul>>(&local_58);
  iVar4 = W->_M_elems[0];
  std::function<QPDFExc(std::basic_string_view<char,std::char_traits<char>>)>::
  function<QPDF::processXRefStream(long_long,QPDFObjectHandle&)::__0&,void>
            ((function<QPDFExc(std::basic_string_view<char,std::char_traits<char>>)> *)&local_c0,
             (anon_class_16_2_099dce64 *)
             &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  iVar4 = processXRefSize(this,(QPDFObjectHandle *)local_48,iVar4,&local_c0);
  std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            (&local_c0);
  local_9c = iVar4;
  std::function<QPDFExc(std::basic_string_view<char,std::char_traits<char>>)>::
  function<QPDF::processXRefStream(long_long,QPDFObjectHandle&)::__0&,void>
            ((function<QPDFExc(std::basic_string_view<char,std::char_traits<char>>)> *)&num_entries,
             (anon_class_16_2_099dce64 *)
             &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  processXRefIndex(&local_e0,this,(QPDFObjectHandle *)local_48,iVar4,
                   (function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
                   &num_entries);
  std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             &num_entries);
  ptVar5 = std::get<0ul,int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                     (&local_e0);
  bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::get<1ul,int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                 (&local_e0);
  QPDFObjectHandle::getStreamData
            ((QPDFObjectHandle *)&actual_size,(qpdf_stream_decode_level_e)xref_obj);
  peVar6 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &actual_size);
  __val = Buffer::getSize(peVar6);
  sVar7 = toS<int>(W->_M_elems);
  sVar8 = toS<int>(ptVar5);
  x.message.field_2._8_8_ = sVar7 * sVar8;
  if (x.message.field_2._8_8_ != __val) {
    std::__cxx11::to_string(&local_240,x.message.field_2._8_8_);
    std::operator+(&local_220,"Cross-reference stream data has the wrong size; expected = ",
                   &local_240);
    std::operator+(&local_200,&local_220,"; actual = ");
    std::__cxx11::to_string((string *)local_260,__val);
    std::operator+(&local_1e0,&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
    local_1c0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1e0);
    processXRefStream::anon_class_16_2_099dce64::operator()
              ((QPDFExc *)local_1b0,
               (anon_class_16_2_099dce64 *)
               &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    if (__val < (ulong)x.message.field_2._8_8_) {
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      QPDFExc::QPDFExc(pQVar9,(QPDFExc *)local_1b0);
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    warn(this,(QPDFExc *)local_1b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_1b0);
  }
  bVar3 = false;
  peVar6 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &actual_size);
  __range1 = (type *)Buffer::getBuffer(peVar6);
  this_00 = bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  local_288._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  this_00._M_pi);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&local_288);
    if (!bVar2) break;
    ppVar10 = __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator*(&__end1);
    obj = *(type_conflict4 **)ppVar10;
    ptVar5 = std::get<0ul,int,int>((pair<int,_int> *)&obj);
    ptVar11 = std::get<1ul,int,int>((pair<int,_int> *)&obj);
    for (fields._M_elems[2]._4_4_ = 0; fields._M_elems[2]._4_4_ < *ptVar11;
        fields._M_elems[2]._4_4_ = fields._M_elems[2]._4_4_ + 1) {
      memset(&j,0,0x18);
      pvVar12 = std::array<int,_3UL>::operator[](ptStack_98,0);
      if (*pvVar12 == 0) {
        QTC::TC("qpdf","QPDF default for xref stream field 0",0);
        pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,0);
        *pvVar13 = 1;
      }
      for (uStack_2c8 = 0; uStack_2c8 < 3; uStack_2c8 = uStack_2c8 + 1) {
        local_2cc = 0;
        while( true ) {
          iVar4 = local_2cc;
          pvVar12 = std::array<int,_3UL>::operator[](ptStack_98,uStack_2c8);
          if (*pvVar12 <= iVar4) break;
          pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,uStack_2c8);
          *pvVar13 = *pvVar13 << 8;
          bVar1 = *(byte *)&(__range1->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
          puVar14 = (ulong *)std::array<long_long,_3UL>::operator[]
                                       ((array<long_long,_3UL> *)&j,uStack_2c8);
          *puVar14 = (ulong)bVar1 | *puVar14;
          local_2cc = local_2cc + 1;
          __range1 = (type *)((long)&(__range1->
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
        }
      }
      if (bVar3) {
        pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,0);
        if (*pvVar13 != 2) {
          pMVar15 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                              (&this->m);
          pMVar15->uncompressed_after_compressed = true;
        }
      }
      else {
        pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,0);
        if (*pvVar13 == 2) {
          bVar3 = true;
        }
      }
      if (*ptVar5 == 0) {
        pMVar15 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                            (&this->m);
        pMVar15->first_xref_item_offset = xref_offset;
      }
      else {
        pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,0);
        if (*pvVar13 == 0) {
          QPDFObjGen::QPDFObjGen(&local_2d4,*ptVar5,0);
          insertFreeXrefEntry(this,local_2d4);
        }
        else {
          iVar4 = *ptVar5;
          pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,0);
          f0 = toI<long_long>(pvVar13);
          pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,1);
          f1 = *pvVar13;
          pvVar13 = std::array<long_long,_3UL>::operator[]((array<long_long,_3UL> *)&j,2);
          f2 = toI<long_long>(pvVar13);
          insertXrefEntry(this,iVar4,f0,f1,f2);
        }
      }
      *ptVar5 = *ptVar5 + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  pMVar15 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                      (&this->m);
  bVar3 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar15->trailer).super_BaseHandle);
  if (!bVar3) {
    QPDFObjectHandle::QPDFObjectHandle(&local_2e8,(QPDFObjectHandle *)local_48);
    setTrailer(this,&local_2e8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_2e8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"/Prev",&local_309);
  bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_48,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_340,"/Prev",&local_341);
    QPDFObjectHandle::getKey(&local_320,(string *)local_48);
    bVar3 = QPDFObjectHandle::isInteger(&local_320);
    QPDFObjectHandle::~QPDFObjectHandle(&local_320);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator(&local_341);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      local_392 = 1;
      pQVar9 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"xref stream",&local_369);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"/Prev key in xref stream dictionary is not an integer",
                 &local_391);
      damagedPDF(pQVar9,this,&local_368,&local_390);
      local_392 = 0;
      __cxa_throw(pQVar9,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QTC::TC("qpdf","QPDF prev key in xref stream dictionary",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3c8,"/Prev",&local_3c9);
    QPDFObjectHandle::getKey(&local_3a8,(string *)local_48);
    this_local = (QPDF *)QPDFObjectHandle::getIntValue(&local_3a8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_3a8);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
  }
  else {
    this_local = (QPDF *)0x0;
  }
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&actual_size);
  std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::~pair
            (&local_e0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  return (qpdf_offset_t)this_local;
}

Assistant:

qpdf_offset_t
QPDF::processXRefStream(qpdf_offset_t xref_offset, QPDFObjectHandle& xref_obj)
{
    auto damaged = [this, xref_offset](std::string_view msg) -> QPDFExc {
        return damagedPDF("xref stream", xref_offset, msg.data());
    };

    auto dict = xref_obj.getDict();

    auto [entry_size, W] = processXRefW(dict, damaged);
    int max_num_entries = processXRefSize(dict, entry_size, damaged);
    auto [num_entries, indx] = processXRefIndex(dict, max_num_entries, damaged);

    std::shared_ptr<Buffer> bp = xref_obj.getStreamData(qpdf_dl_specialized);
    size_t actual_size = bp->getSize();
    auto expected_size = toS(entry_size) * toS(num_entries);

    if (expected_size != actual_size) {
        QPDFExc x = damaged(
            "Cross-reference stream data has the wrong size; expected = " +
            std::to_string(expected_size) + "; actual = " + std::to_string(actual_size));
        if (expected_size > actual_size) {
            throw x;
        } else {
            warn(x);
        }
    }

    bool saw_first_compressed_object = false;

    // Actual size vs. expected size check above ensures that we will not overflow any buffers here.
    // We know that entry_size * num_entries is less or equal to the size of the buffer.
    auto p = bp->getBuffer();
    for (auto [obj, sec_entries]: indx) {
        // Process a subsection.
        for (int i = 0; i < sec_entries; ++i) {
            // Read this entry
            std::array<qpdf_offset_t, 3> fields{};
            if (W[0] == 0) {
                QTC::TC("qpdf", "QPDF default for xref stream field 0");
                fields[0] = 1;
            }
            for (size_t j = 0; j < 3; ++j) {
                for (int k = 0; k < W[j]; ++k) {
                    fields[j] <<= 8;
                    fields[j] |= *p++;
                }
            }

            // Get the generation number.  The generation number is 0 unless this is an uncompressed
            // object record, in which case the generation number appears as the third field.
            if (saw_first_compressed_object) {
                if (fields[0] != 2) {
                    m->uncompressed_after_compressed = true;
                }
            } else if (fields[0] == 2) {
                saw_first_compressed_object = true;
            }
            if (obj == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = xref_offset;
            } else if (fields[0] == 0) {
                // Ignore fields[2], which we don't care about in this case. This works around the
                // issue of some PDF files that put invalid values, like -1, here for deleted
                // objects.
                insertFreeXrefEntry(QPDFObjGen(obj, 0));
            } else {
                insertXrefEntry(obj, toI(fields[0]), fields[1], toI(fields[2]));
            }
            ++obj;
        }
    }

    if (!m->trailer) {
        setTrailer(dict);
    }

    if (dict.hasKey("/Prev")) {
        if (!dict.getKey("/Prev").isInteger()) {
            throw damagedPDF(
                "xref stream", "/Prev key in xref stream dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in xref stream dictionary");
        return dict.getKey("/Prev").getIntValue();
    } else {
        return 0;
    }
}